

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Warfare_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Warfare_Header *this)

{
  ostream *poVar1;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Warfare_Header *local_18;
  Warfare_Header *this_local;
  
  local_18 = this;
  this_local = (Warfare_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Firing Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_FiringEntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"Target Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_TargetEntityID);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Munition ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_270,&this->m_MunitionID);
  UTILS::IndentString(&local_250,&local_270,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_2b0,&this->m_EventID);
  UTILS::IndentString(&local_290,&local_2b0,1,'\t');
  std::operator<<(poVar1,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Warfare_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Firing Entity ID:\n"
       << IndentString( m_FiringEntityID.GetAsString(), 1 )
       << "Target Entity ID:\n"
       << IndentString( m_TargetEntityID.GetAsString(), 1 )
       << "Munition ID:\n"
       << IndentString( m_MunitionID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 );

    return ss.str();
}